

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O2

void addEpochs<CoreML::Specification::NeuralNetwork>
               (NeuralNetwork *nn,int64_t defaultValue,int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  NetworkUpdateParameters *this;
  Int64Parameter *this_00;
  Int64Set *this_01;
  _Base_ptr p_Var1;
  Int64Range *pIVar2;
  
  this = CoreML::Specification::NeuralNetwork::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::mutable_epochs(this);
  this_00->defaultvalue_ = defaultValue;
  if ((allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
    pIVar2->minvalue_ = minValue;
    pIVar2->maxvalue_ = maxValue;
  }
  else {
    this_01 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    for (p_Var1 = (allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(allowedValues->_M_t)._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      CoreML::Specification::Int64Set::add_values(this_01,*(int64 *)(p_Var1 + 1));
    }
  }
  return;
}

Assistant:

void addEpochs(NeuralNetworkClass *nn, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto epochs = updateParameters->mutable_epochs();
    
    epochs->set_defaultvalue(defaultValue);
    
    if (allowedValues.size() == 0) {
        auto int64Range = epochs->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = epochs->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}